

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O0

void apply_motor_speed(SpurUserParamsPtr spur)

{
  MotorControlMode MVar1;
  char id;
  int iVar2;
  ParametersPtr p_Var3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int cnt_max;
  int force_send_control_mode;
  int v;
  ParametersPtr param;
  int i;
  SpurUserParamsPtr spur_local;
  
  p_Var3 = get_param_ptr();
  spur->run_mode_cnt = spur->run_mode_cnt + 1;
  for (param._4_4_ = MOTOR_RIGHT; (int)param._4_4_ < 0x10; param._4_4_ = param._4_4_ + MOTOR_LEFT) {
    if (p_Var3->motor_enable[(int)param._4_4_] != 0) {
      bVar4 = false;
      dVar5 = p(YP_PARAM_CONTROL_MODE_RESEND,param._4_4_);
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        dVar5 = p(YP_PARAM_CONTROL_MODE_RESEND,param._4_4_);
        dVar6 = p(YP_PARAM_CONTROL_CYCLE,param._4_4_);
        bVar4 = spur->run_mode_cnt % (int)(dVar5 / dVar6) == (int)param._4_4_ % (int)(dVar5 / dVar6)
        ;
      }
      id = (char)param._4_4_;
      if ((spur->wheel_mode[(int)param._4_4_] != spur->wheel_mode_prev[(int)param._4_4_]) || (bVar4)
         ) {
        MVar1 = spur->wheel_mode[(int)param._4_4_];
        if (MVar1 == MOTOR_CONTROL_OPENFREE) {
          parameter_set('@',id,5);
        }
        else if (MVar1 == MOTOR_CONTROL_FREE) {
          parameter_set('@',id,2);
        }
        else if (MVar1 - MOTOR_CONTROL_VEHICLE < 4) {
          parameter_set('@',id,3);
        }
      }
      spur->wheel_mode_prev[(int)param._4_4_] = spur->wheel_mode[(int)param._4_4_];
      if (spur->wheel_mode[(int)param._4_4_] < MOTOR_CONTROL_VEHICLE) {
        parameter_set('\0',id,0);
      }
      else if (spur->wheel_mode[(int)param._4_4_] - MOTOR_CONTROL_VEHICLE < 4) {
        iVar2 = option(OPTION_HIGH_PREC);
        if (iVar2 == 0) {
          dVar5 = spur->wheel_vel_smooth[(int)param._4_4_];
          dVar6 = p(YP_PARAM_GEAR,param._4_4_);
          dVar7 = p(YP_PARAM_COUNT_REV,param._4_4_);
          dVar8 = p(YP_PARAM_CYCLE,param._4_4_);
          parameter_set('\0',id,(long)(int)((dVar5 * dVar6 * dVar7 * dVar8) / 6.283185307179586));
        }
        else {
          dVar5 = spur->wheel_vel_smooth[(int)param._4_4_];
          dVar6 = p(YP_PARAM_GEAR,param._4_4_);
          dVar7 = p(YP_PARAM_COUNT_REV,param._4_4_);
          dVar8 = p(YP_PARAM_CYCLE,param._4_4_);
          parameter_set('\x01',id,
                        (long)(int)((dVar5 * 16.0 * dVar6 * dVar7 * dVar8) / 6.283185307179586));
        }
      }
    }
  }
  return;
}

Assistant:

void apply_motor_speed(SpurUserParamsPtr spur)
{
  int i;
  ParametersPtr param;
  param = get_param_ptr();
  spur->run_mode_cnt++;

  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    int v;
    if (!param->motor_enable[i])
      continue;

    int force_send_control_mode = 0;
    if (p(YP_PARAM_CONTROL_MODE_RESEND, i) != 0.0)
    {
      int cnt_max = p(YP_PARAM_CONTROL_MODE_RESEND, i) / p(YP_PARAM_CONTROL_CYCLE, i);
      if (spur->run_mode_cnt % cnt_max == i % cnt_max)
        force_send_control_mode = 1;
    }

    if (spur->wheel_mode[i] != spur->wheel_mode_prev[i] || force_send_control_mode)
    {
      switch (spur->wheel_mode[i])
      {
        case MOTOR_CONTROL_OPENFREE:
          parameter_set(PARAM_servo, i, SERVO_LEVEL_OPENFREE);
          break;
        case MOTOR_CONTROL_FREE:
          parameter_set(PARAM_servo, i, SERVO_LEVEL_TORQUE);
          break;
        case MOTOR_CONTROL_ANGLE:
        case MOTOR_CONTROL_ANGLE_VEL:
        case MOTOR_CONTROL_VEL:
        case MOTOR_CONTROL_VEHICLE:
          parameter_set(PARAM_servo, i, SERVO_LEVEL_VELOCITY);
          break;
      }
    }
    spur->wheel_mode_prev[i] = spur->wheel_mode[i];

    switch (spur->wheel_mode[i])
    {
      case MOTOR_CONTROL_OPENFREE:
      case MOTOR_CONTROL_FREE:
        parameter_set(PARAM_w_ref, i, 0);
        break;
      case MOTOR_CONTROL_ANGLE:
      case MOTOR_CONTROL_ANGLE_VEL:
      case MOTOR_CONTROL_VEL:
      case MOTOR_CONTROL_VEHICLE:
        if (option(OPTION_HIGH_PREC))
        {
          v = (double)(16 * spur->wheel_vel_smooth[i] *
                       p(YP_PARAM_GEAR, i) * p(YP_PARAM_COUNT_REV, i) * p(YP_PARAM_CYCLE, i) /
                       (2 * M_PI));
          parameter_set(PARAM_w_ref_highprec, i, v);
        }
        else
        {
          v = (double)(spur->wheel_vel_smooth[i] *
                       p(YP_PARAM_GEAR, i) * p(YP_PARAM_COUNT_REV, i) * p(YP_PARAM_CYCLE, i) /
                       (2 * M_PI));
          parameter_set(PARAM_w_ref, i, v);
        }
        break;
    }
  }
}